

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffbfwt(FITSfile *Fptr,int nbuff,int *status)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  LONGLONG filepos;
  long nloop;
  long minrec;
  long irec;
  long jj;
  int ibuff;
  int ii;
  int *status_local;
  int nbuff_local;
  FITSfile *Fptr_local;
  
  if (Fptr->writemode == 0) {
    ffpmsg("Error: trying to write to READONLY file.");
    if (Fptr->driver == 8) {
      ffpmsg("Cannot write to a GZIP or COMPRESS compressed file.");
    }
    Fptr->dirty[nbuff] = 0;
    *status = 0x70;
    Fptr_local._4_4_ = *status;
  }
  else {
    lVar2 = Fptr->bufrecnum[nbuff] * 0xb40;
    if (Fptr->filesize < lVar2) {
      if (Fptr->io_pos != Fptr->filesize) {
        ffseek(Fptr,Fptr->filesize);
      }
      jj._0_4_ = 0x28;
      while ((int)jj != nbuff) {
        minrec = Fptr->bufrecnum[nbuff];
        jj._0_4_ = nbuff;
        for (jj._4_4_ = 0; jj._4_4_ < 0x28; jj._4_4_ = jj._4_4_ + 1) {
          if ((Fptr->filesize / 0xb40 <= Fptr->bufrecnum[jj._4_4_]) &&
             (Fptr->bufrecnum[jj._4_4_] < minrec)) {
            minrec = Fptr->bufrecnum[jj._4_4_];
            jj._0_4_ = jj._4_4_;
          }
        }
        lVar2 = minrec * 0xb40;
        if (Fptr->filesize < lVar2) {
          lVar1 = Fptr->filesize;
          irec = 0;
          while( true ) {
            bVar3 = false;
            if (irec < (lVar2 - lVar1) / 0xb40) {
              bVar3 = *status == 0;
            }
            if (!bVar3) break;
            ffwrite(Fptr,0xb40,ffbfwt::zeros,status);
            irec = irec + 1;
          }
          Fptr->filesize = lVar2;
        }
        ffwrite(Fptr,0xb40,Fptr->iobuffer + (int)jj * 0xb40,status);
        Fptr->dirty[(int)jj] = 0;
        Fptr->filesize = Fptr->filesize + 0xb40;
      }
      Fptr->io_pos = Fptr->filesize;
    }
    else {
      if (Fptr->io_pos != lVar2) {
        ffseek(Fptr,lVar2);
      }
      ffwrite(Fptr,0xb40,Fptr->iobuffer + nbuff * 0xb40,status);
      Fptr->io_pos = lVar2 + 0xb40;
      if (lVar2 == Fptr->filesize) {
        Fptr->filesize = Fptr->filesize + 0xb40;
      }
      Fptr->dirty[nbuff] = 0;
    }
    Fptr_local._4_4_ = *status;
  }
  return Fptr_local._4_4_;
}

Assistant:

int ffbfwt(FITSfile *Fptr,        /* I - FITS file pointer           */
           int nbuff,             /* I - which buffer to write          */
           int *status)           /* IO - error status                  */
{
/*
  write contents of buffer to file;  If the position of the buffer
  is beyond the current EOF, then the file may need to be extended
  with fill values, and/or with the contents of some of the other
  i/o buffers.
*/
    int  ii,ibuff;
    long jj, irec, minrec, nloop;
    LONGLONG filepos;

    static char zeros[IOBUFLEN];  /*  initialized to zero by default */

    if (!(Fptr->writemode) )
    {
        ffpmsg("Error: trying to write to READONLY file.");
        if (Fptr->driver == 8) {  /* gzip compressed file */
	  ffpmsg("Cannot write to a GZIP or COMPRESS compressed file.");
	}
        Fptr->dirty[nbuff] = FALSE;  /* reset buffer status to prevent later probs */
        *status = READONLY_FILE;
        return(*status);
    }

    filepos = (LONGLONG)Fptr->bufrecnum[nbuff] * IOBUFLEN;

    if (filepos <= Fptr->filesize)
    {
      /* record is located within current file, so just write it */

      /* move to the correct write position */
      if (Fptr->io_pos != filepos)
         ffseek(Fptr, filepos);

      ffwrite(Fptr, IOBUFLEN, Fptr->iobuffer + (nbuff * IOBUFLEN), status);
      Fptr->io_pos = filepos + IOBUFLEN;

      if (filepos == Fptr->filesize)   /* appended new record? */
         Fptr->filesize += IOBUFLEN;   /* increment the file size */

      Fptr->dirty[nbuff] = FALSE;
    }

    else  /* if record is beyond the EOF, append any other records */ 
          /* and/or insert fill values if necessary */
    {
      /* move to EOF */
      if (Fptr->io_pos != Fptr->filesize)
         ffseek(Fptr, Fptr->filesize);

      ibuff = NIOBUF;  /* initialize to impossible value */
      while(ibuff != nbuff) /* repeat until requested buffer is written */
      {
        minrec = (long) (Fptr->filesize / IOBUFLEN);

        /* write lowest record beyond the EOF first */

        irec = Fptr->bufrecnum[nbuff]; /* initially point to the requested buffer */
        ibuff = nbuff;

        for (ii = 0; ii < NIOBUF; ii++)
        {
          if (Fptr->bufrecnum[ii] >= minrec &&
            Fptr->bufrecnum[ii] < irec)
          {
            irec = Fptr->bufrecnum[ii];  /* found a lower record */
            ibuff = ii;
          }
        }

        filepos = (LONGLONG)irec * IOBUFLEN;  /* byte offset of record in file */

        /* append 1 or more fill records if necessary */
        if (filepos > Fptr->filesize)
        {                    
          nloop = (long) ((filepos - (Fptr->filesize)) / IOBUFLEN); 
          for (jj = 0; jj < nloop && !(*status); jj++)
            ffwrite(Fptr, IOBUFLEN, zeros, status);

/*
ffseek(Fptr, filepos);
*/
          Fptr->filesize = filepos;   /* increment the file size */
        } 

        /* write the buffer itself */
        ffwrite(Fptr, IOBUFLEN, Fptr->iobuffer + (ibuff * IOBUFLEN), status);
        Fptr->dirty[ibuff] = FALSE;

        Fptr->filesize += IOBUFLEN;     /* increment the file size */
      } /* loop back if more buffers need to be written */

      Fptr->io_pos = Fptr->filesize;  /* currently positioned at EOF */
    }

    return(*status);       
}